

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall
gutil::Properties::getValue<float>(Properties *this,char *key,float *value,float *defvalue)

{
  byte bVar1;
  long lVar2;
  undefined8 uVar3;
  float *in_RCX;
  float *in_RDX;
  string *in_RSI;
  char *in_RDI;
  istringstream in;
  string v;
  allocator *__lhs;
  allocator local_251;
  string local_250 [8];
  string *in_stack_fffffffffffffdb8;
  IOException *in_stack_fffffffffffffdc0;
  istringstream local_1d0 [400];
  string local_40 [32];
  float *local_20;
  float *local_18;
  string *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  gutil::Properties::getString(in_RDI,local_10,(char *)local_40);
  *local_18 = *local_20;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::__cxx11::istringstream::istringstream(local_1d0,local_40,_S_in);
    std::istream::operator>>(local_1d0,local_18);
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) != 0) {
      uVar3 = __cxa_allocate_exception(0x28);
      __lhs = &local_251;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,(char *)local_10,__lhs);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)local_10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
      IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      __cxa_throw(uVar3,&IOException::typeinfo,IOException::~IOException);
    }
    std::__cxx11::istringstream::~istringstream(local_1d0);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void getValue(const char *key, T &value,
                                     const T &defvalue) const
    {
      std::string v;

      getString(key, v, "");

      value=defvalue;

      if (v.size() > 0)
      {
        std::istringstream in(v);
        in >> value;

        if (in.fail())
        {
          throw IOException("Format error: "+std::string(key)+"="+v);
        }
      }
    }